

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_key_share_entry(uint16_t *group,ptls_iovec_t *key_exchange,uint8_t **src,uint8_t *end)

{
  byte *pbVar1;
  uint8_t *puVar2;
  ptls_iovec_t pVar3;
  uint8_t *local_58;
  size_t local_50;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint8_t *end_local;
  uint8_t **src_local;
  ptls_iovec_t *key_exchange_local;
  uint16_t *group_local;
  
  _capacity._4_4_ = ptls_decode16(group,src,end);
  if (_capacity._4_4_ == 0) {
    _block_size = 2;
    if ((ulong)((long)end - (long)*src) < 2) {
      _capacity._4_4_ = 0x32;
    }
    else {
      end_1 = (uint8_t *)0x0;
      do {
        pbVar1 = *src;
        *src = pbVar1 + 1;
        end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*pbVar1);
        _block_size = _block_size - 1;
      } while (_block_size != 0);
      if (end + -(long)*src < end_1) {
        _capacity._4_4_ = 0x32;
      }
      else {
        puVar2 = *src + (long)end_1;
        pVar3 = ptls_iovec_init(*src,(long)puVar2 - (long)*src);
        local_58 = pVar3.base;
        key_exchange->base = local_58;
        local_50 = pVar3.len;
        key_exchange->len = local_50;
        *src = puVar2;
        if (*src != puVar2) {
          _capacity._4_4_ = 0x32;
        }
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int decode_key_share_entry(uint16_t *group, ptls_iovec_t *key_exchange, const uint8_t **src, const uint8_t *const end)
{
    int ret;

    if ((ret = ptls_decode16(group, src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(*src, end, 2, {
        *key_exchange = ptls_iovec_init(*src, end - *src);
        *src = end;
    });

Exit:
    return ret;
}